

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

string * __thiscall
helics::FederateState::processQuery_abi_cxx11_
          (string *__return_storage_ptr__,FederateState *this,string_view query,bool force_ordering)

{
  long lVar1;
  __atomic_flag_data_type _Var2;
  int iVar3;
  string *psVar4;
  char *pcVar5;
  size_t __n;
  size_type __len1;
  undefined7 in_register_00000081;
  size_type __len2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  size_type __rlen;
  string_view fmt;
  format_args args;
  string sStack_68;
  pointer local_48;
  size_type sStack_40;
  
  pcVar5 = query._M_str;
  __n = query._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((int)CONCAT71(in_register_00000081,force_ordering) != 0) {
LAB_0031aba8:
    if (__n == 5) {
switchD_0031abe8_caseD_0:
      iVar3 = bcmp(pcVar5,"state",__n);
      if (iVar3 == 0) {
        psVar4 = fedStateString_abi_cxx11_((this->state)._M_i);
        local_48 = (psVar4->_M_dataplus)._M_p;
        sStack_40 = psVar4->_M_string_length;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x4;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&local_48;
        ::fmt::v11::vformat_abi_cxx11_(&sStack_68,(v11 *)0x451ef1,fmt,args);
        processQuery_abi_cxx11_();
        return __return_storage_ptr__;
      }
    }
    else {
      if (__n == 0x11) goto switchD_0031abe8_caseD_c;
LAB_0031abbc:
      if (__n == 7) goto switchD_0031abe8_caseD_2;
    }
    goto switchD_0031abe8_caseD_3;
  }
  lVar1 = __n - 5;
  switch(lVar1) {
  case 0:
    goto switchD_0031abe8_caseD_0;
  case 1:
switchD_0031abe8_caseD_1:
    iVar3 = bcmp(pcVar5,"inputs",__n);
    if (iVar3 == 0) goto LAB_0031accb;
    switch(lVar1) {
    case 0:
      goto switchD_0031abe8_caseD_0;
    case 1:
    case 3:
    case 5:
    case 6:
      break;
    case 2:
      goto switchD_0031abe8_caseD_2;
    case 4:
      goto switchD_0031abe8_caseD_4;
    case 7:
switchD_0031ac4c_caseD_7:
      iVar3 = bcmp(pcVar5,"global_state",__n);
      if (iVar3 == 0) {
LAB_0031accb:
        processQueryActual_abi_cxx11_(&sStack_68,this,query);
        processQuery_abi_cxx11_();
        return __return_storage_ptr__;
      }
      goto LAB_0031aba8;
    default:
      goto switchD_0031ac18_default;
    }
  case 2:
switchD_0031abe8_caseD_2:
    iVar3 = bcmp(pcVar5,"queries",__n);
    if (iVar3 == 0) goto LAB_0031ad3b;
    if (__n == 5) goto switchD_0031abe8_caseD_0;
switchD_0031ac18_default:
    if (__n == 0x11) goto switchD_0031abe8_caseD_c;
    break;
  case 4:
switchD_0031abe8_caseD_4:
    iVar3 = bcmp(pcVar5,"endpoints",__n);
    if (iVar3 == 0) goto LAB_0031accb;
    if ((long)__n < 0xc) {
      if (__n == 5) goto switchD_0031abe8_caseD_0;
      goto LAB_0031abbc;
    }
    if (__n == 0x11) goto switchD_0031abe8_caseD_c;
    if (__n == 0xc) goto switchD_0031ac4c_caseD_7;
    break;
  case 7:
    iVar3 = bcmp(pcVar5,"publications",__n);
    if (iVar3 == 0) goto LAB_0031accb;
    switch(lVar1) {
    case 0:
      goto switchD_0031abe8_caseD_0;
    case 1:
      goto switchD_0031abe8_caseD_1;
    case 2:
      goto switchD_0031abe8_caseD_2;
    case 4:
      goto switchD_0031abe8_caseD_4;
    case 7:
      goto switchD_0031ac4c_caseD_7;
    case 0xc:
      goto switchD_0031abe8_caseD_c;
    }
    break;
  case 0xc:
switchD_0031abe8_caseD_c:
    iVar3 = bcmp(pcVar5,"available_queries",__n);
    if (iVar3 != 0) {
      if (__n == 5) goto switchD_0031abe8_caseD_0;
      break;
    }
LAB_0031ad3b:
    __len2 = 0xd1;
    pcVar5 = 
    "\"publications\",\"inputs\",\"logs\",\"endpoints\",\"subscriptions\",\"current_state\",\"global_state\",\"dependencies\",\"timeconfig\",\"config\",\"dependents\",\"current_time\",\"global_time\",\"global_status\",\"unconnected_interfaces\""
    ;
    __len1 = 0;
    goto LAB_0031ad4a;
  }
switchD_0031abe8_caseD_3:
  LOCK();
  _Var2 = (this->processing).super___atomic_flag_base._M_i;
  (this->processing).super___atomic_flag_base._M_i = true;
  UNLOCK();
  if (_Var2 == false) {
    processQueryActual_abi_cxx11_(&sStack_68,this,query);
    processQuery_abi_cxx11_();
  }
  else {
    __len1 = __return_storage_ptr__->_M_string_length;
    __len2 = 5;
    pcVar5 = "#wait";
LAB_0031ad4a:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,0,__len1,pcVar5,__len2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FederateState::processQuery(std::string_view query, bool force_ordering) const
{
    std::string qstring;
    if (!force_ordering &&
        (query == "publications" || query == "inputs" || query == "endpoints" ||
         query == "global_state")) {  // these never need to be locked
        qstring = processQueryActual(query);
    } else if ((query == "queries") || (query == "available_queries")) {
        qstring =
            R"("publications","inputs","logs","endpoints","subscriptions","current_state","global_state","dependencies","timeconfig","config","dependents","current_time","global_time","global_status","unconnected_interfaces")";
    } else if (query == "state") {
        qstring = fmt::format("\"{}\"", fedStateString(getState()));
    } else {  // the rest might need be locked to prevent a race condition
        if (try_lock()) {
            qstring = processQueryActual(query);
            unlock();
        } else {
            qstring = "#wait";
        }
    }
    return qstring;
}